

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# capnpc-c++.c++
# Opt level: O0

InterfaceText * __thiscall
capnp::anon_unknown_1::CapnpcCppMain::makeInterfaceText
          (InterfaceText *__return_storage_ptr__,CapnpcCppMain *this,StringPtr scope,StringPtr name,
          InterfaceSchema schema,Array<kj::StringTree> *nestedTypeDecls,
          TemplateContext *templateContext)

{
  StringPtr hexId_00;
  StringPtr type;
  StringPtr fullName_00;
  CapnpcCppMain *schema_00;
  bool bVar1;
  uint64_t uVar2;
  size_t sVar3;
  BrandInitializerText *pBVar4;
  StringTree *pSVar5;
  StringTree *pSVar6;
  CappedArray<char,_17UL> *params;
  Schema params_2;
  char *params_4;
  char (*in_stack_fffffffffffff100) [26];
  char (*in_stack_fffffffffffff108) [6];
  char (*in_stack_fffffffffffff188) [180];
  char (*in_stack_fffffffffffff1b8) [24];
  CappedArray<char,_17UL> local_d20;
  ArrayPtr<const_char> local_d00;
  anon_class_1_0_00000001 local_ce9;
  Mapper<kj::Array<capnp::(anonymous_namespace)::CapnpcCppMain::MethodText>_&> local_ce8;
  Array<kj::StringTree> local_ce0;
  StringTree local_cc8;
  ArrayPtr<const_char> local_c90;
  anon_class_1_0_00000001 local_c79;
  Mapper<kj::Array<capnp::(anonymous_namespace)::CapnpcCppMain::ExtendInfo>_&> local_c78;
  Array<kj::StringTree> local_c70;
  CappedArray<char,_17UL> local_c58;
  StringTree local_c38;
  anon_class_1_0_00000001 local_bf9;
  Mapper<kj::Array<capnp::(anonymous_namespace)::CapnpcCppMain::MethodText>_&> local_bf8;
  Array<kj::StringTree> local_bf0;
  anon_class_1_0_00000001 local_bd1;
  Mapper<kj::Array<capnp::(anonymous_namespace)::CapnpcCppMain::MethodText>_&> local_bd0;
  Array<kj::StringTree> local_bc8;
  StringTree local_bb0;
  StringTree local_b78;
  StringTree local_b40;
  StringTree local_b08;
  StringTree local_ad0;
  StringTree local_a98;
  StringTree local_a60;
  anon_class_1_0_00000001 local_a21;
  Mapper<kj::Array<capnp::(anonymous_namespace)::CapnpcCppMain::MethodText>_&> local_a20;
  Array<kj::StringTree> local_a18;
  anon_class_1_0_00000001 local_9f9;
  Mapper<kj::Array<capnp::(anonymous_namespace)::CapnpcCppMain::ExtendInfo>_&> local_9f8;
  Array<kj::StringTree> local_9f0;
  StringTree local_9d8;
  anon_class_1_0_00000001 local_999;
  Mapper<kj::Array<capnp::(anonymous_namespace)::CapnpcCppMain::MethodText>_&> local_998;
  StringTree local_990;
  Schema local_958;
  char *pcStack_950;
  StringTree local_940;
  anon_class_1_0_00000001 local_901;
  Mapper<kj::Array<capnp::(anonymous_namespace)::CapnpcCppMain::ExtendInfo>_&> local_900;
  Array<kj::StringTree> local_8f8;
  StringTree local_8e0;
  anon_class_1_0_00000001 local_8a1;
  Mapper<kj::Array<kj::StringTree>_&> local_8a0;
  Array<kj::StringTree> local_898;
  ArrayPtr<const_char> local_880;
  StringTree local_870;
  StringTree local_838;
  ArrayPtr<const_char> local_800;
  StringTree local_7f0;
  char *local_7b8;
  StringTree local_7b0;
  StringTree local_778;
  StringTree local_740;
  BrandInitializerText local_708;
  String local_658;
  StringPtr local_640;
  StringPtr local_630;
  StringTree local_620;
  StringTree local_5e8;
  StringTree local_5b0;
  StringTree local_578;
  byte local_539;
  CapnpcCppMain *pCStack_538;
  bool hasDeps;
  undefined1 local_530 [8];
  BrandInitializerText brandInitializers;
  StringTree defineText;
  StringTree declareText;
  undefined1 local_3d8 [8];
  String templates;
  undefined1 local_3b0 [8];
  CppTypeName clientName;
  undefined1 local_320 [8];
  CppTypeName typeName;
  Mapper<std::map<unsigned_long,_capnp::InterfaceSchema,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_capnp::InterfaceSchema>_>_>_&>
  local_2d8;
  Array<capnp::(anonymous_namespace)::CapnpcCppMain::ExtendInfo> local_2d0;
  Reader local_2b8;
  uint64_t local_288;
  CapnpcCppMain *local_280;
  undefined1 local_278 [8];
  map<unsigned_long,_capnp::InterfaceSchema,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_capnp::InterfaceSchema>_>_>
  map;
  Array<capnp::(anonymous_namespace)::CapnpcCppMain::ExtendInfo> transitiveSuperclasses;
  SuperclassList local_228;
  Mapper<capnp::InterfaceSchema::SuperclassList> local_1f0;
  undefined1 local_1b8 [8];
  Array<capnp::(anonymous_namespace)::CapnpcCppMain::ExtendInfo> superclasses;
  CappedArray<char,_17UL> hexId;
  Reader proto;
  MethodList local_138;
  Mapper<capnp::InterfaceSchema::MethodList> local_100;
  undefined1 local_c8 [8];
  Array<capnp::(anonymous_namespace)::CapnpcCppMain::MethodText> methods;
  ArrayPtr<const_char> local_a0;
  StringTree local_90;
  undefined1 local_58 [8];
  String fullName;
  CapnpcCppMain *this_local;
  InterfaceSchema schema_local;
  StringPtr name_local;
  StringPtr scope_local;
  
  name_local.content.ptr = (char *)name.content.size_;
  params_2.raw = (RawBrandedSchema *)name.content.ptr;
  name_local.content.size_ = (size_t)scope.content.ptr;
  this_local = (CapnpcCppMain *)schema.super_Schema.raw;
  fullName.content.disposer = (ArrayDisposer *)this;
  schema_local.super_Schema.raw = (Schema)(Schema)params_2.raw;
  kj::StringPtr::StringPtr((StringPtr *)&local_a0,(void *)0x0);
  TemplateContext::args(&local_90,templateContext,(StringPtr)local_a0);
  kj::str<kj::StringPtr&,kj::StringPtr&,kj::StringTree>
            ((String *)local_58,(kj *)&name_local.content.size_,(StringPtr *)&schema_local,
             (StringPtr *)&local_90,(StringTree *)params_2.raw);
  kj::StringTree::~StringTree(&local_90);
  InterfaceSchema::getMethods(&local_138,(InterfaceSchema *)&this_local);
  kj::_::Mapper<capnp::InterfaceSchema::MethodList>::Mapper(&local_100,&local_138);
  proto._reader._40_8_ = this;
  kj::_::Mapper<capnp::InterfaceSchema::MethodList>::
  operator*<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_Cosmic_Sans[P]capnproto_c___src_capnp_compiler_capnpc_c___c__:2286:20)>
            ((Array<capnp::(anonymous_namespace)::CapnpcCppMain::MethodText> *)local_c8,&local_100,
             (anon_class_24_3_1e8b4e60 *)&proto._reader.nestingLimit);
  Schema::getProto((Reader *)(hexId.content + 0x10),(Schema *)&this_local);
  uVar2 = capnp::schema::Node::Reader::getId((Reader *)(hexId.content + 0x10));
  kj::hex((CappedArray<char,_17UL> *)&superclasses.disposer,uVar2);
  InterfaceSchema::getSuperclasses(&local_228,(InterfaceSchema *)&this_local);
  kj::_::Mapper<capnp::InterfaceSchema::SuperclassList>::Mapper(&local_1f0,&local_228);
  transitiveSuperclasses.disposer = (ArrayDisposer *)this;
  kj::_::Mapper<capnp::InterfaceSchema::SuperclassList>::
  operator*<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_Cosmic_Sans[P]capnproto_c___src_capnp_compiler_capnpc_c___c__:2293:25)>
            ((Array<capnp::(anonymous_namespace)::CapnpcCppMain::ExtendInfo> *)local_1b8,&local_1f0,
             (anon_class_8_1_8991fb9c *)&transitiveSuperclasses.disposer);
  kj::Array<capnp::(anonymous_namespace)::CapnpcCppMain::ExtendInfo>::Array
            ((Array<capnp::(anonymous_namespace)::CapnpcCppMain::ExtendInfo> *)
             &map._M_t._M_impl.super__Rb_tree_header._M_node_count);
  std::
  map<unsigned_long,_capnp::InterfaceSchema,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_capnp::InterfaceSchema>_>_>
  ::map((map<unsigned_long,_capnp::InterfaceSchema,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_capnp::InterfaceSchema>_>_>
         *)local_278);
  local_280 = this_local;
  getTransitiveSuperclasses
            (this,(InterfaceSchema)this_local,
             (map<unsigned_long,_capnp::InterfaceSchema,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_capnp::InterfaceSchema>_>_>
              *)local_278);
  Schema::getProto(&local_2b8,(Schema *)&this_local);
  local_288 = capnp::schema::Node::Reader::getId(&local_2b8);
  std::
  map<unsigned_long,_capnp::InterfaceSchema,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_capnp::InterfaceSchema>_>_>
  ::erase((map<unsigned_long,_capnp::InterfaceSchema,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_capnp::InterfaceSchema>_>_>
           *)local_278,&local_288);
  kj::_::
  Mapper<std::map<unsigned_long,_capnp::InterfaceSchema,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_capnp::InterfaceSchema>_>_>_&>
  ::Mapper(&local_2d8,
           (map<unsigned_long,_capnp::InterfaceSchema,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_capnp::InterfaceSchema>_>_>
            *)local_278);
  typeName._56_8_ = this;
  kj::_::
  Mapper<std::map<unsigned_long,_capnp::InterfaceSchema,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_capnp::InterfaceSchema>_>_>_&>
  ::
  operator*<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_Cosmic_Sans[P]capnproto_c___src_capnp_compiler_capnpc_c___c__:2302:32)>
            (&local_2d0,&local_2d8,(anon_class_8_1_8991fb9c *)&typeName.isArgDependent);
  kj::Array<capnp::(anonymous_namespace)::CapnpcCppMain::ExtendInfo>::operator=
            ((Array<capnp::(anonymous_namespace)::CapnpcCppMain::ExtendInfo> *)
             &map._M_t._M_impl.super__Rb_tree_header._M_node_count,&local_2d0);
  kj::Array<capnp::(anonymous_namespace)::CapnpcCppMain::ExtendInfo>::~Array(&local_2d0);
  std::
  map<unsigned_long,_capnp::InterfaceSchema,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_capnp::InterfaceSchema>_>_>
  ::~map((map<unsigned_long,_capnp::InterfaceSchema,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_capnp::InterfaceSchema>_>_>
          *)local_278);
  schema_00 = this_local;
  kj::Maybe<capnp::InterfaceSchema::Method>::Maybe
            ((Maybe<capnp::InterfaceSchema::Method> *)&clientName.isArgDependent,(void *)0x0);
  cppFullName((CppTypeName *)local_320,this,(Schema)schema_00,
              (Maybe<capnp::InterfaceSchema::Method> *)&clientName.isArgDependent);
  kj::Maybe<capnp::InterfaceSchema::Method>::~Maybe
            ((Maybe<capnp::InterfaceSchema::Method> *)&clientName.isArgDependent);
  CppTypeName::CppTypeName((CppTypeName *)local_3b0,(CppTypeName *)local_320);
  kj::StringPtr::StringPtr((StringPtr *)&templates.content.disposer,"Client");
  CppTypeName::addMemberType((CppTypeName *)local_3b0,(StringPtr)stack0xfffffffffffffc40);
  TemplateContext::allDecls((StringTree *)&declareText.branches.disposer,templateContext);
  kj::str<kj::StringTree>((String *)local_3d8,(StringTree *)&declareText.branches.disposer);
  kj::StringTree::~StringTree((StringTree *)&declareText.branches.disposer);
  kj::strTree<char_const(&)[79],kj::CappedArray<char,17ul>&,char_const(&)[3]>
            ((StringTree *)&defineText.branches.disposer,
             (kj *)
             "  #if !CAPNP_LITE\n  struct _capnpPrivate {\n    CAPNP_DECLARE_INTERFACE_HEADER(",
             (char (*) [79])&superclasses.disposer,(CappedArray<char,_17UL> *)")\n",
             (char (*) [3])params_2.raw);
  params_4 = "constexpr ::capnp::Kind ";
  pSVar6 = (StringTree *)0x418bbb;
  kj::
  strTree<char_const(&)[4],kj::String&,char_const(&)[2],char_const(&)[17],kj::String&,char_const(&)[25],kj::String&,char_const(&)[24],kj::String&,char_const(&)[40],kj::String&,char_const(&)[26]>
            ((StringTree *)&brandInitializers.dependencyCount,(kj *)"// ",(char (*) [4])local_58,
             (String *)0x418bbb,(char (*) [2])0x417f88,(char (*) [17])local_3d8,
             (String *)"constexpr ::capnp::Kind ",(char (*) [25])local_58,
             (String *)"::_capnpPrivate::kind;\n",(char (*) [24])local_3d8,
             (String *)"constexpr ::capnp::_::RawSchema const* ",(char (*) [40])local_58,
             (String *)"::_capnpPrivate::schema;\n",in_stack_fffffffffffff100);
  bVar1 = TemplateContext::isGeneric(templateContext);
  if (bVar1) {
    pCStack_538 = this_local;
    makeBrandInitializers((BrandInitializerText *)local_530,this,templateContext,(Schema)this_local)
    ;
    sVar3 = kj::StringTree::size((StringTree *)&brandInitializers.bindings.branches.disposer);
    local_539 = sVar3 != 0;
    pSVar6 = kj::mv<kj::StringTree>((StringTree *)&defineText.branches.disposer);
    pSVar5 = (StringTree *)(ulong)(local_539 & 1);
    makeGenericDeclarations(&local_5b0,this,templateContext,SUB41(local_539 & 1,0));
    kj::strTree<kj::StringTree,kj::StringTree>(&local_578,(kj *)pSVar6,&local_5b0,pSVar5);
    kj::StringTree::operator=((StringTree *)&defineText.branches.disposer,&local_578);
    kj::StringTree::~StringTree(&local_578);
    kj::StringTree::~StringTree(&local_5b0);
    pSVar6 = kj::mv<kj::StringTree>((StringTree *)&brandInitializers.dependencyCount);
    kj::StringPtr::StringPtr(&local_630,(String *)local_58);
    kj::str<kj::CappedArray<char,17ul>&>(&local_658,(kj *)&superclasses.disposer,params);
    kj::StringPtr::StringPtr(&local_640,&local_658);
    pBVar4 = kj::mv<capnp::(anonymous_namespace)::CapnpcCppMain::BrandInitializerText>
                       ((BrandInitializerText *)local_530);
    BrandInitializerText::BrandInitializerText(&local_708,pBVar4);
    fullName_00.content.size_ = local_630.content.size_;
    fullName_00.content.ptr = local_630.content.ptr;
    hexId_00.content.size_ = local_640.content.size_;
    hexId_00.content.ptr = local_640.content.ptr;
    makeGenericDefinitions(&local_620,this,templateContext,fullName_00,hexId_00,&local_708);
    kj::strTree<kj::StringTree,kj::StringTree>
              (&local_5e8,(kj *)pSVar6,&local_620,(StringTree *)local_630.content.ptr);
    kj::StringTree::operator=((StringTree *)&brandInitializers.dependencyCount,&local_5e8);
    kj::StringTree::~StringTree(&local_5e8);
    kj::StringTree::~StringTree(&local_620);
    BrandInitializerText::~BrandInitializerText(&local_708);
    kj::String::~String(&local_658);
    BrandInitializerText::~BrandInitializerText((BrandInitializerText *)local_530);
    pSVar6 = (StringTree *)local_630.content.ptr;
    params_4 = local_640.content.ptr;
  }
  else {
    pSVar5 = kj::mv<kj::StringTree>((StringTree *)&defineText.branches.disposer);
    kj::strTree<kj::StringTree,char_const(&)[100]>
              (&local_740,(kj *)pSVar5,
               (StringTree *)
               "    static constexpr ::capnp::_::RawBrandedSchema const* brand() { return &schema->defaultBrand; }\n"
               ,(char (*) [100])pSVar6);
    kj::StringTree::operator=((StringTree *)&defineText.branches.disposer,&local_740);
    kj::StringTree::~StringTree(&local_740);
  }
  pSVar5 = kj::mv<kj::StringTree>((StringTree *)&defineText.branches.disposer);
  kj::strTree<kj::StringTree,char_const(&)[30]>
            (&local_778,(kj *)pSVar5,(StringTree *)"  };\n  #endif  // !CAPNP_LITE",
             (char (*) [30])pSVar6);
  kj::StringTree::operator=((StringTree *)&defineText.branches.disposer,&local_778);
  kj::StringTree::~StringTree(&local_778);
  pSVar5 = kj::mv<kj::StringTree>((StringTree *)&brandInitializers.dependencyCount);
  kj::strTree<kj::StringTree,char_const(&)[25]>
            (&local_7b0,(kj *)pSVar5,(StringTree *)0x418e2f,(char (*) [25])pSVar6);
  kj::StringTree::operator=((StringTree *)&brandInitializers.dependencyCount,&local_7b0);
  kj::StringTree::~StringTree(&local_7b0);
  bVar1 = TemplateContext::hasParams(templateContext);
  local_7b8 = "";
  if (bVar1) {
    local_7b8 = "  ";
  }
  kj::StringPtr::StringPtr((StringPtr *)&local_800,(void *)0x0);
  TemplateContext::decl(&local_7f0,templateContext,true,(StringPtr)local_800);
  kj::strTree<char_const*,kj::StringTree,char_const(&)[10],kj::StringPtr&,char_const(&)[3]>
            (&__return_storage_ptr__->outerTypeDecl,(kj *)&local_7b8,(char **)&local_7f0,
             (StringTree *)"  struct ",(char (*) [10])&schema_local,(StringPtr *)0x4197d1,
             (char (*) [3])params_4);
  TemplateContext::parentDecls(&local_838,templateContext);
  bVar1 = kj::StringPtr::operator==((StringPtr *)&name_local.content.size_,(void *)0x0);
  kj::StringPtr::StringPtr((StringPtr *)&local_880,(void *)0x0);
  TemplateContext::decl(&local_870,templateContext,bVar1,(StringPtr)local_880);
  kj::_::Mapper<kj::Array<kj::StringTree>_&>::Mapper(&local_8a0,nestedTypeDecls);
  kj::_::Mapper<kj::Array<kj::StringTree>_&>::
  operator*<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_Cosmic_Sans[P]capnproto_c___src_capnp_compiler_capnpc_c___c__:2360:11)>
            (&local_898,&local_8a0,&local_8a1);
  pSVar6 = kj::mv<kj::StringTree>((StringTree *)&defineText.branches.disposer);
  kj::
  strTree<kj::StringTree,kj::StringTree,char_const(&)[8],kj::StringPtr&,kj::StringPtr&,char_const(&)[4],char_const(&)[3],kj::StringPtr&,char_const(&)[87],kj::Array<kj::StringTree>,char_const(&)[2],kj::StringTree,char_const(&)[6]>
            (&__return_storage_ptr__->outerTypeDef,(kj *)&local_838,&local_870,
             (StringTree *)0x418a43,(char (*) [8])&name_local.content.size_,
             (StringPtr *)&schema_local,(StringPtr *)0x41956d,(char (*) [4])0x417f08,
             (char (*) [3])&schema_local,
             (StringPtr *)
             "() = delete;\n\n#if !CAPNP_LITE\n  class Client;\n  class Server;\n#endif  // !CAPNP_LITE\n\n"
             ,(char (*) [87])&local_898,(Array<kj::StringTree> *)0x418bbb,(char (*) [2])pSVar6,
             (StringTree *)0x41a1f6,in_stack_fffffffffffff108);
  TemplateContext::allDecls(&local_8e0,templateContext);
  kj::_::Mapper<kj::Array<capnp::(anonymous_namespace)::CapnpcCppMain::ExtendInfo>_&>::Mapper
            (&local_900,(Array<capnp::(anonymous_namespace)::CapnpcCppMain::ExtendInfo> *)local_1b8)
  ;
  kj::_::Mapper<kj::Array<capnp::(anonymous_namespace)::CapnpcCppMain::ExtendInfo>_&>::
  operator*<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_Cosmic_Sans[P]capnproto_c___src_capnp_compiler_capnpc_c___c__:2371:11)>
            (&local_8f8,&local_900,&local_901);
  local_958 = schema_local.super_Schema.raw;
  pcStack_950 = name_local.content.ptr;
  local_990.text.content.disposer = (ArrayDisposer *)0x0;
  local_990.branches.ptr = (Branch *)0x0;
  local_990.branches.size_ = 0;
  kj::String::String((String *)&local_990.text.content.disposer);
  type.content.size_ = (size_t)pcStack_950;
  type.content.ptr = (char *)local_958.raw;
  makeAsGenericDef(&local_940,this,CLIENT,templateContext,type,
                   (String *)&local_990.text.content.disposer);
  kj::_::Mapper<kj::Array<capnp::(anonymous_namespace)::CapnpcCppMain::MethodText>_&>::Mapper
            (&local_998,(Array<capnp::(anonymous_namespace)::CapnpcCppMain::MethodText> *)local_c8);
  kj::_::Mapper<kj::Array<capnp::(anonymous_namespace)::CapnpcCppMain::MethodText>_&>::
  operator*<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_Cosmic_Sans[P]capnproto_c___src_capnp_compiler_capnpc_c___c__:2391:11)>
            ((Array<kj::StringTree> *)&local_990,&local_998,&local_999);
  TemplateContext::allDecls(&local_9d8,templateContext);
  kj::_::Mapper<kj::Array<capnp::(anonymous_namespace)::CapnpcCppMain::ExtendInfo>_&>::Mapper
            (&local_9f8,(Array<capnp::(anonymous_namespace)::CapnpcCppMain::ExtendInfo> *)local_1b8)
  ;
  kj::_::Mapper<kj::Array<capnp::(anonymous_namespace)::CapnpcCppMain::ExtendInfo>_&>::
  operator*<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_Cosmic_Sans[P]capnproto_c___src_capnp_compiler_capnpc_c___c__:2400:11)>
            (&local_9f0,&local_9f8,&local_9f9);
  kj::_::Mapper<kj::Array<capnp::(anonymous_namespace)::CapnpcCppMain::MethodText>_&>::Mapper
            (&local_a20,(Array<capnp::(anonymous_namespace)::CapnpcCppMain::MethodText> *)local_c8);
  kj::_::Mapper<kj::Array<capnp::(anonymous_namespace)::CapnpcCppMain::MethodText>_&>::
  operator*<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_Cosmic_Sans[P]capnproto_c___src_capnp_compiler_capnpc_c___c__:2411:11)>
            (&local_a18,&local_a20,&local_a21);
  kj::
  strTree<char_const(&)[17],kj::StringTree,char_const(&)[7],kj::String&,char_const(&)[58],kj::Array<kj::StringTree>,char_const(&)[22],kj::StringPtr&,char_const(&)[19],kj::StringPtr&,char_const(&)[517],kj::StringTree,kj::Array<kj::StringTree>,char_const(&)[39],kj::StringTree,char_const(&)[7],kj::String&,char_const(&)[58],kj::Array<kj::StringTree>,char_const(&)[12],char_const(&)[11],kj::StringPtr&,char_const(&)[194],kj::Array<kj::StringTree>,char_const(&)[11],capnp::(anonymous_namespace)::CppTypeName&,char_const(&)[89],capnp::(anonymous_namespace)::CppTypeName&,char_const(&)[180]>
            (&__return_storage_ptr__->clientServerDefs,(kj *)0x417f88,(char (*) [17])&local_8e0,
             (StringTree *)0x418849,(char (*) [7])local_58,
             (String *)"::Client\n    : public virtual ::capnp::Capability::Client",
             (char (*) [58])&local_8f8,(Array<kj::StringTree> *)0x41a605,
             (char (*) [22])&schema_local,(StringPtr *)" Calls;\n  typedef ",
             (char (*) [19])&schema_local,
             (StringPtr *)
             " Reads;\n\n  Client(decltype(nullptr));\n  explicit Client(::kj::Own< ::capnp::ClientHook>&& hook);\n  template <typename _t, typename = ::kj::EnableIf< ::kj::canConvert<_t*, Server*>()>>\n  Client(::kj::Own<_t>&& server);\n  template <typename _t, typename = ::kj::EnableIf< ::kj::canConvert<_t*, Client*>()>>\n  Client(::kj::Promise<_t>&& promise);\n  Client(::kj::Exception&& exception);\n  Client(Client&) = default;\n  Client(Client&&) = default;\n  Client& operator=(Client& other);\n  Client& operator=(Client&& other);\n\n"
             ,(char (*) [517])&local_940,&local_990,
             (Array<kj::StringTree> *)"\nprotected:\n  Client() = default;\n};\n\n",
             (char (*) [39])&local_9d8,(StringTree *)0x418849,(char (*) [7])local_58,
             (String *)"::Server\n    : public virtual ::capnp::Capability::Server",
             (char (*) [58])&local_9f0,(Array<kj::StringTree> *)" {\npublic:\n",
             (char (*) [12])0x41a610,(char (*) [11])&schema_local,
             (StringPtr *)
             " Serves;\n\n  ::kj::Promise<void> dispatchCall(uint64_t interfaceId, uint16_t methodId,\n      ::capnp::CallContext< ::capnp::AnyPointer, ::capnp::AnyPointer> context)\n      override;\n\nprotected:\n"
             ,(char (*) [194])&local_a18,(Array<kj::StringTree> *)0x418dbf,(char (*) [11])local_3b0,
             (CppTypeName *)
             " thisCap() {\n    return ::capnp::Capability::Server::thisCap()\n        .template castAs<"
             ,(char (*) [89])local_320,
             (CppTypeName *)
             ">();\n  }\n\n  ::kj::Promise<void> dispatchCallInternal(uint16_t methodId,\n      ::capnp::CallContext< ::capnp::AnyPointer, ::capnp::AnyPointer> context);\n};\n#endif  // !CAPNP_LITE\n\n"
             ,in_stack_fffffffffffff188);
  TemplateContext::allDecls(&local_a60,templateContext);
  TemplateContext::allDecls(&local_a98,templateContext);
  TemplateContext::allDecls(&local_ad0,templateContext);
  TemplateContext::allDecls(&local_b08,templateContext);
  TemplateContext::allDecls(&local_b40,templateContext);
  TemplateContext::allDecls(&local_b78,templateContext);
  TemplateContext::allDecls(&local_bb0,templateContext);
  kj::_::Mapper<kj::Array<capnp::(anonymous_namespace)::CapnpcCppMain::MethodText>_&>::Mapper
            (&local_bd0,(Array<capnp::(anonymous_namespace)::CapnpcCppMain::MethodText> *)local_c8);
  kj::_::Mapper<kj::Array<capnp::(anonymous_namespace)::CapnpcCppMain::MethodText>_&>::
  operator*<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_Cosmic_Sans[P]capnproto_c___src_capnp_compiler_capnpc_c___c__:2455:11)>
            (&local_bc8,&local_bd0,&local_bd1);
  pSVar6 = (StringTree *)local_3b0;
  kj::
  strTree<char_const(&)[17],kj::StringTree,char_const(&)[8],kj::String&,char_const(&)[83],kj::StringTree,char_const(&)[8],kj::String&,char_const(&)[116],kj::StringTree,char_const(&)[41],kj::String&,char_const(&)[97],kj::StringTree,char_const(&)[41],kj::String&,char_const(&)[103],kj::StringTree,char_const(&)[8],kj::String&,char_const(&)[105],kj::StringTree,char_const(&)[8],capnp::(anonymous_namespace)::CppTypeName&,char_const(&)[3],kj::String&,char_const(&)[105],kj::StringTree,char_const(&)[8],capnp::(anonymous_namespace)::CppTypeName&,char_const(&)[3],kj::String&,char_const(&)[115],kj::Array<kj::StringTree>,char_const(&)[24]>
            (&__return_storage_ptr__->inlineMethodDefs,(kj *)0x417f88,(char (*) [17])&local_a60,
             (StringTree *)0x41ae30,(char (*) [8])local_58,
             (String *)
             "::Client::Client(decltype(nullptr))\n    : ::capnp::Capability::Client(nullptr) {}\n",
             (char (*) [83])&local_a98,(StringTree *)0x41ae30,(char (*) [8])local_58,
             (String *)
             "::Client::Client(\n    ::kj::Own< ::capnp::ClientHook>&& hook)\n    : ::capnp::Capability::Client(::kj::mv(hook)) {}\n"
             ,(char (*) [116])&local_ad0,(StringTree *)"template <typename _t, typename>\ninline ",
             (char (*) [41])local_58,
             (String *)
             "::Client::Client(::kj::Own<_t>&& server)\n    : ::capnp::Capability::Client(::kj::mv(server)) {}\n"
             ,(char (*) [97])&local_b08,(StringTree *)"template <typename _t, typename>\ninline ",
             (char (*) [41])local_58,
             (String *)
             "::Client::Client(::kj::Promise<_t>&& promise)\n    : ::capnp::Capability::Client(::kj::mv(promise)) {}\n"
             ,(char (*) [103])&local_b40,(StringTree *)0x41ae30,(char (*) [8])local_58,
             (String *)
             "::Client::Client(::kj::Exception&& exception)\n    : ::capnp::Capability::Client(::kj::mv(exception)) {}\n"
             ,(char (*) [105])&local_b78,(StringTree *)0x41ae30,(char (*) [8])pSVar6,
             (CppTypeName *)"& ",(char (*) [3])local_58,
             (String *)
             "::Client::operator=(Client& other) {\n  ::capnp::Capability::Client::operator=(other);\n  return *this;\n}\n"
             ,(char (*) [105])&local_bb0,(StringTree *)0x41ae30,(char (*) [8])pSVar6,
             (CppTypeName *)"& ",(char (*) [3])local_58,
             (String *)
             "::Client::operator=(Client&& other) {\n  ::capnp::Capability::Client::operator=(kj::mv(other));\n  return *this;\n}\n\n"
             ,(char (*) [115])&local_bc8,(Array<kj::StringTree> *)0x4180e6,in_stack_fffffffffffff1b8
            );
  kj::_::Mapper<kj::Array<capnp::(anonymous_namespace)::CapnpcCppMain::MethodText>_&>::Mapper
            (&local_bf8,(Array<capnp::(anonymous_namespace)::CapnpcCppMain::MethodText> *)local_c8);
  kj::_::Mapper<kj::Array<capnp::(anonymous_namespace)::CapnpcCppMain::MethodText>_&>::
  operator*<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_Cosmic_Sans[P]capnproto_c___src_capnp_compiler_capnpc_c___c__:2460:11)>
            (&local_bf0,&local_bf8,&local_bf9);
  TemplateContext::allDecls(&local_c38,templateContext);
  uVar2 = capnp::schema::Node::Reader::getId((Reader *)(hexId.content + 0x10));
  kj::hex(&local_c58,uVar2);
  kj::_::Mapper<kj::Array<capnp::(anonymous_namespace)::CapnpcCppMain::ExtendInfo>_&>::Mapper
            (&local_c78,
             (Array<capnp::(anonymous_namespace)::CapnpcCppMain::ExtendInfo> *)
             &map._M_t._M_impl.super__Rb_tree_header._M_node_count);
  kj::_::Mapper<kj::Array<capnp::(anonymous_namespace)::CapnpcCppMain::ExtendInfo>_&>::
  operator*<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_Cosmic_Sans[P]capnproto_c___src_capnp_compiler_capnpc_c___c__:2468:11)>
            (&local_c70,&local_c78,&local_c79);
  local_c90 = (ArrayPtr<const_char>)
              capnp::schema::Node::Reader::getDisplayName((Reader *)(hexId.content + 0x10));
  TemplateContext::allDecls(&local_cc8,templateContext);
  kj::_::Mapper<kj::Array<capnp::(anonymous_namespace)::CapnpcCppMain::MethodText>_&>::Mapper
            (&local_ce8,(Array<capnp::(anonymous_namespace)::CapnpcCppMain::MethodText> *)local_c8);
  kj::_::Mapper<kj::Array<capnp::(anonymous_namespace)::CapnpcCppMain::MethodText>_&>::
  operator*<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_Cosmic_Sans[P]capnproto_c___src_capnp_compiler_capnpc_c___c__:2483:11)>
            (&local_ce0,&local_ce8,&local_ce9);
  local_d00 = (ArrayPtr<const_char>)
              capnp::schema::Node::Reader::getDisplayName((Reader *)(hexId.content + 0x10));
  uVar2 = capnp::schema::Node::Reader::getId((Reader *)(hexId.content + 0x10));
  kj::hex(&local_d20,uVar2);
  pSVar5 = kj::mv<kj::StringTree>((StringTree *)&brandInitializers.dependencyCount);
  kj::
  strTree<char_const(&)[17],kj::Array<kj::StringTree>,kj::StringTree,char_const(&)[21],kj::String&,char_const(&)[185],kj::CappedArray<char,17ul>,char_const(&)[60],kj::Array<kj::StringTree>,char_const(&)[50],capnp::Text::Reader,char_const(&)[24],kj::StringTree,char_const(&)[21],kj::String&,char_const(&)[157],kj::Array<kj::StringTree>,char_const(&)[111],capnp::Text::Reader,char_const(&)[16],kj::CappedArray<char,17ul>,char_const(&)[47],kj::StringTree>
            (&__return_storage_ptr__->sourceDefs,(kj *)0x417f88,(char (*) [17])&local_bf0,
             (Array<kj::StringTree> *)&local_c38,(StringTree *)0x41b3fe,(char (*) [21])local_58,
             (String *)
             "::Server::dispatchCall(\n    uint64_t interfaceId, uint16_t methodId,\n    ::capnp::CallContext< ::capnp::AnyPointer, ::capnp::AnyPointer> context) {\n  switch (interfaceId) {\n    case 0x"
             ,(char (*) [185])&local_c58,
             (CappedArray<char,_17UL> *)
             "ull:\n      return dispatchCallInternal(methodId, context);\n",
             (char (*) [60])&local_c70,
             (Array<kj::StringTree> *)"    default:\n      return internalUnimplemented(\"",
             (char (*) [50])&local_c90,(Reader *)"\", interfaceId);\n  }\n}\n",
             (char (*) [24])&local_cc8,(StringTree *)0x41b3fe,(char (*) [21])local_58,
             (String *)
             "::Server::dispatchCallInternal(\n    uint16_t methodId,\n    ::capnp::CallContext< ::capnp::AnyPointer, ::capnp::AnyPointer> context) {\n  switch (methodId) {\n"
             ,(char (*) [157])&local_ce0,
             (Array<kj::StringTree> *)
             "    default:\n      (void)context;\n      return ::capnp::Capability::Server::internalUnimplemented(\n          \""
             ,(char (*) [111])&local_d00,(Reader *)"\",\n          0x",(char (*) [16])&local_d20,
             (CappedArray<char,_17UL> *)"ull, methodId);\n  }\n}\n#endif  // !CAPNP_LITE\n\n",
             (char (*) [47])pSVar5,pSVar6);
  kj::Array<kj::StringTree>::~Array(&local_ce0);
  kj::StringTree::~StringTree(&local_cc8);
  kj::Array<kj::StringTree>::~Array(&local_c70);
  kj::StringTree::~StringTree(&local_c38);
  kj::Array<kj::StringTree>::~Array(&local_bf0);
  kj::Array<kj::StringTree>::~Array(&local_bc8);
  kj::StringTree::~StringTree(&local_bb0);
  kj::StringTree::~StringTree(&local_b78);
  kj::StringTree::~StringTree(&local_b40);
  kj::StringTree::~StringTree(&local_b08);
  kj::StringTree::~StringTree(&local_ad0);
  kj::StringTree::~StringTree(&local_a98);
  kj::StringTree::~StringTree(&local_a60);
  kj::Array<kj::StringTree>::~Array(&local_a18);
  kj::Array<kj::StringTree>::~Array(&local_9f0);
  kj::StringTree::~StringTree(&local_9d8);
  kj::Array<kj::StringTree>::~Array((Array<kj::StringTree> *)&local_990);
  kj::StringTree::~StringTree(&local_940);
  kj::String::~String((String *)&local_990.text.content.disposer);
  kj::Array<kj::StringTree>::~Array(&local_8f8);
  kj::StringTree::~StringTree(&local_8e0);
  kj::Array<kj::StringTree>::~Array(&local_898);
  kj::StringTree::~StringTree(&local_870);
  kj::StringTree::~StringTree(&local_838);
  kj::StringTree::~StringTree(&local_7f0);
  kj::StringTree::~StringTree((StringTree *)&brandInitializers.dependencyCount);
  kj::StringTree::~StringTree((StringTree *)&defineText.branches.disposer);
  kj::String::~String((String *)local_3d8);
  CppTypeName::~CppTypeName((CppTypeName *)local_3b0);
  CppTypeName::~CppTypeName((CppTypeName *)local_320);
  kj::Array<capnp::(anonymous_namespace)::CapnpcCppMain::ExtendInfo>::~Array
            ((Array<capnp::(anonymous_namespace)::CapnpcCppMain::ExtendInfo> *)
             &map._M_t._M_impl.super__Rb_tree_header._M_node_count);
  kj::Array<capnp::(anonymous_namespace)::CapnpcCppMain::ExtendInfo>::~Array
            ((Array<capnp::(anonymous_namespace)::CapnpcCppMain::ExtendInfo> *)local_1b8);
  kj::Array<capnp::(anonymous_namespace)::CapnpcCppMain::MethodText>::~Array
            ((Array<capnp::(anonymous_namespace)::CapnpcCppMain::MethodText> *)local_c8);
  kj::String::~String((String *)local_58);
  return __return_storage_ptr__;
}

Assistant:

InterfaceText makeInterfaceText(kj::StringPtr scope, kj::StringPtr name, InterfaceSchema schema,
                                  kj::Array<kj::StringTree> nestedTypeDecls,
                                  const TemplateContext& templateContext) {
    auto fullName = kj::str(scope, name, templateContext.args());
    auto methods = KJ_MAP(m, schema.getMethods()) {
      return makeMethodText(fullName, m, templateContext);
    };

    auto proto = schema.getProto();
    auto hexId = kj::hex(proto.getId());

    auto superclasses = KJ_MAP(superclass, schema.getSuperclasses()) {
      return ExtendInfo { cppFullName(superclass, nullptr), superclass.getProto().getId() };
    };

    kj::Array<ExtendInfo> transitiveSuperclasses;
    {
      std::map<uint64_t, InterfaceSchema> map;
      getTransitiveSuperclasses(schema, map);
      map.erase(schema.getProto().getId());
      transitiveSuperclasses = KJ_MAP(entry, map) {
        return ExtendInfo { cppFullName(entry.second, nullptr), entry.second.getProto().getId() };
      };
    }

    CppTypeName typeName = cppFullName(schema, nullptr);

    CppTypeName clientName = typeName;
    clientName.addMemberType("Client");

    kj::String templates = kj::str(templateContext.allDecls());  // Ends with a newline

    // Private members struct
    kj::StringTree declareText = kj::strTree(
         "  #if !CAPNP_LITE\n"
         "  struct _capnpPrivate {\n"
         "    CAPNP_DECLARE_INTERFACE_HEADER(", hexId, ")\n");

    kj::StringTree defineText = kj::strTree(
        "// ", fullName, "\n",
        "#if !CAPNP_LITE\n",
        templates, "constexpr ::capnp::Kind ", fullName, "::_capnpPrivate::kind;\n",
        templates, "constexpr ::capnp::_::RawSchema const* ", fullName, "::_capnpPrivate::schema;\n");

    if (templateContext.isGeneric()) {
      auto brandInitializers = makeBrandInitializers(templateContext, schema);
      bool hasDeps = (brandInitializers.dependencies.size() != 0);

      declareText = kj::strTree(kj::mv(declareText),
          makeGenericDeclarations(templateContext, hasDeps));

      defineText = kj::strTree(kj::mv(defineText),
          makeGenericDefinitions(
              templateContext, fullName, kj::str(hexId), kj::mv(brandInitializers)));
    } else {
      declareText = kj::strTree(kj::mv(declareText),
        "    static constexpr ::capnp::_::RawBrandedSchema const* brand() { return &schema->defaultBrand; }\n");
    }

    declareText = kj::strTree(kj::mv(declareText), "  };\n  #endif  // !CAPNP_LITE");
    defineText = kj::strTree(kj::mv(defineText), "#endif  // !CAPNP_LITE\n\n");

    return InterfaceText {
      kj::strTree(
          templateContext.hasParams() ? "  " : "", templateContext.decl(true),
          "  struct ", name, ";\n"),

      kj::strTree(
          templateContext.parentDecls(),
          templateContext.decl(scope == nullptr),
          "struct ", scope, name, " {\n",
          "  ", name, "() = delete;\n"
          "\n"
          "#if !CAPNP_LITE\n"
          "  class Client;\n"
          "  class Server;\n"
          "#endif  // !CAPNP_LITE\n"
          "\n",
          KJ_MAP(n, nestedTypeDecls) { return kj::mv(n); },
          "\n",
          kj::mv(declareText), "\n"
          "};\n"
          "\n"),

      kj::strTree(
          "#if !CAPNP_LITE\n",
          templateContext.allDecls(),
          "class ", fullName, "::Client\n"
          "    : public virtual ::capnp::Capability::Client",
          KJ_MAP(s, superclasses) {
            return kj::strTree(",\n      public virtual ", s.typeName.strNoTypename(), "::Client");
          }, " {\n"
          "public:\n"
          "  typedef ", name, " Calls;\n"
          "  typedef ", name, " Reads;\n"
          "\n"
          "  Client(decltype(nullptr));\n"
          "  explicit Client(::kj::Own< ::capnp::ClientHook>&& hook);\n"
          "  template <typename _t, typename = ::kj::EnableIf< ::kj::canConvert<_t*, Server*>()>>\n"
          "  Client(::kj::Own<_t>&& server);\n"
          "  template <typename _t, typename = ::kj::EnableIf< ::kj::canConvert<_t*, Client*>()>>\n"
          "  Client(::kj::Promise<_t>&& promise);\n"
          "  Client(::kj::Exception&& exception);\n"
          "  Client(Client&) = default;\n"
          "  Client(Client&&) = default;\n"
          "  Client& operator=(Client& other);\n"
          "  Client& operator=(Client&& other);\n"
          "\n",
          makeAsGenericDef(AsGenericRole::CLIENT, templateContext, name),
          KJ_MAP(m, methods) { return kj::mv(m.clientDecls); },
          "\n"
          "protected:\n"
          "  Client() = default;\n"
          "};\n"
          "\n",
          templateContext.allDecls(),
          "class ", fullName, "::Server\n"
          "    : public virtual ::capnp::Capability::Server",
          KJ_MAP(s, superclasses) {
            return kj::strTree(",\n      public virtual ", s.typeName.strNoTypename(), "::Server");
          }, " {\n"
          "public:\n",
          "  typedef ", name, " Serves;\n"
          "\n"
          "  ::kj::Promise<void> dispatchCall(uint64_t interfaceId, uint16_t methodId,\n"
          "      ::capnp::CallContext< ::capnp::AnyPointer, ::capnp::AnyPointer> context)\n"
          "      override;\n"
          "\n"
          "protected:\n",
          KJ_MAP(m, methods) { return kj::mv(m.serverDecls); },
          "\n"
          "  inline ", clientName, " thisCap() {\n"
          "    return ::capnp::Capability::Server::thisCap()\n"
          "        .template castAs<", typeName, ">();\n"
          "  }\n"
          "\n"
          "  ::kj::Promise<void> dispatchCallInternal(uint16_t methodId,\n"
          "      ::capnp::CallContext< ::capnp::AnyPointer, ::capnp::AnyPointer> context);\n"
          "};\n"
          "#endif  // !CAPNP_LITE\n"
          "\n"),

      kj::strTree(
          "#if !CAPNP_LITE\n",
          templateContext.allDecls(),
          "inline ", fullName, "::Client::Client(decltype(nullptr))\n"
          "    : ::capnp::Capability::Client(nullptr) {}\n",
          templateContext.allDecls(),
          "inline ", fullName, "::Client::Client(\n"
          "    ::kj::Own< ::capnp::ClientHook>&& hook)\n"
          "    : ::capnp::Capability::Client(::kj::mv(hook)) {}\n",
          templateContext.allDecls(),
          "template <typename _t, typename>\n"
          "inline ", fullName, "::Client::Client(::kj::Own<_t>&& server)\n"
          "    : ::capnp::Capability::Client(::kj::mv(server)) {}\n",
          templateContext.allDecls(),
          "template <typename _t, typename>\n"
          "inline ", fullName, "::Client::Client(::kj::Promise<_t>&& promise)\n"
          "    : ::capnp::Capability::Client(::kj::mv(promise)) {}\n",
          templateContext.allDecls(),
          "inline ", fullName, "::Client::Client(::kj::Exception&& exception)\n"
          "    : ::capnp::Capability::Client(::kj::mv(exception)) {}\n",
          templateContext.allDecls(),
          "inline ", clientName, "& ", fullName, "::Client::operator=(Client& other) {\n"
          "  ::capnp::Capability::Client::operator=(other);\n"
          "  return *this;\n"
          "}\n",
          templateContext.allDecls(),
          "inline ", clientName, "& ", fullName, "::Client::operator=(Client&& other) {\n"
          "  ::capnp::Capability::Client::operator=(kj::mv(other));\n"
          "  return *this;\n"
          "}\n"
          "\n",
          KJ_MAP(m, methods) { return kj::mv(m.inlineDefs); },
          "#endif  // !CAPNP_LITE\n"),

      kj::strTree(
          "#if !CAPNP_LITE\n",
          KJ_MAP(m, methods) { return kj::mv(m.sourceDefs); },
          templateContext.allDecls(),
          "::kj::Promise<void> ", fullName, "::Server::dispatchCall(\n"
          "    uint64_t interfaceId, uint16_t methodId,\n"
          "    ::capnp::CallContext< ::capnp::AnyPointer, ::capnp::AnyPointer> context) {\n"
          "  switch (interfaceId) {\n"
          "    case 0x", kj::hex(proto.getId()), "ull:\n"
          "      return dispatchCallInternal(methodId, context);\n",
          KJ_MAP(s, transitiveSuperclasses) {
            return kj::strTree(
              "    case 0x", kj::hex(s.id), "ull:\n"
              "      return ", s.typeName.strNoTypename(),
                         "::Server::dispatchCallInternal(methodId, context);\n");
          },
          "    default:\n"
          "      return internalUnimplemented(\"", proto.getDisplayName(), "\", interfaceId);\n"
          "  }\n"
          "}\n",
          templateContext.allDecls(),
          "::kj::Promise<void> ", fullName, "::Server::dispatchCallInternal(\n"
          "    uint16_t methodId,\n"
          "    ::capnp::CallContext< ::capnp::AnyPointer, ::capnp::AnyPointer> context) {\n"
          "  switch (methodId) {\n",
          KJ_MAP(m, methods) { return kj::mv(m.dispatchCase); },
          "    default:\n"
          "      (void)context;\n"
          "      return ::capnp::Capability::Server::internalUnimplemented(\n"
          "          \"", proto.getDisplayName(), "\",\n"
          "          0x", kj::hex(proto.getId()), "ull, methodId);\n"
          "  }\n"
          "}\n"
          "#endif  // !CAPNP_LITE\n"
          "\n",
          kj::mv(defineText))
    };
  }